

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5MultiIterAdvanced(Fts5Index *p,Fts5Iter *pIter,int iChanged,int iMinset)

{
  int iVar1;
  int iOut;
  
  iOut = iChanged + pIter->nSeg;
  while( true ) {
    iOut = iOut / 2;
    if (iOut < iMinset) {
      return;
    }
    if (p->rc != 0) break;
    iVar1 = fts5MultiIterDoCompare(pIter,iOut);
    if (iVar1 != 0) {
      (*pIter->aSeg[iVar1].xNext)(p,pIter->aSeg + iVar1,(int *)0x0);
      iOut = pIter->nSeg + iVar1;
    }
  }
  return;
}

Assistant:

static void fts5MultiIterAdvanced(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  Fts5Iter *pIter,                /* Iterator to update aFirst[] array for */
  int iChanged,                   /* Index of sub-iterator just advanced */
  int iMinset                     /* Minimum entry in aFirst[] to set */
){
  int i;
  for(i=(pIter->nSeg+iChanged)/2; i>=iMinset && p->rc==SQLITE_OK; i=i/2){
    int iEq;
    if( (iEq = fts5MultiIterDoCompare(pIter, i)) ){
      Fts5SegIter *pSeg = &pIter->aSeg[iEq];
      assert( p->rc==SQLITE_OK );
      pSeg->xNext(p, pSeg, 0);
      i = pIter->nSeg + iEq;
    }
  }
}